

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::RobustnessTestCase
          (RobustnessTestCase *this,EglTestContext *eglTestCtx,char *name,char *description,
          Params *params)

{
  pointer pcVar1;
  FixedFunctionType FVar2;
  ContextResetType CVar3;
  ShaderType SVar4;
  ResourceType RVar5;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_021108a8;
  (this->m_params).m_name._M_dataplus._M_p = (pointer)&(this->m_params).m_name.field_2;
  pcVar1 = (params->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_params,pcVar1,pcVar1 + (params->m_name)._M_string_length);
  (this->m_params).m_description._M_dataplus._M_p = (pointer)&(this->m_params).m_description.field_2
  ;
  pcVar1 = (params->m_description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_params).m_description,pcVar1,
             pcVar1 + (params->m_description)._M_string_length);
  FVar2 = params->m_fixedFunctionType;
  (this->m_params).m_readWriteType = params->m_readWriteType;
  (this->m_params).m_fixedFunctionType = FVar2;
  CVar3 = params->m_contextResetType;
  SVar4 = params->m_shaderType;
  RVar5 = params->m_resourceType;
  (this->m_params).m_robustAccessType = params->m_robustAccessType;
  (this->m_params).m_contextResetType = CVar3;
  (this->m_params).m_shaderType = SVar4;
  (this->m_params).m_resourceType = RVar5;
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglConfig = (EGLConfig)0x0;
  this->m_eglSurface = (EGLSurface)0x0;
  this->m_window = (NativeWindow *)0x0;
  (this->m_glContextType).super_ApiType.m_bits = 0x300;
  return;
}

Assistant:

RobustnessTestCase::RobustnessTestCase (EglTestContext& eglTestCtx, const char* name, const char* description, Params params)
	: TestCase			(eglTestCtx, name, description)
	, m_params			(params)
	, m_eglDisplay		(EGL_NO_DISPLAY)
	, m_eglConfig		(0)
	, m_eglSurface		(EGL_NO_SURFACE)
	, m_window			(DE_NULL)
{
}